

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sx1231_kaku.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  char *spi_path;
  size_t sStack_50;
  rf_dev_t dev;
  char *tmp;
  uint8_t local_34;
  undefined1 local_33;
  undefined1 local_32;
  byte local_31;
  
  pcVar8 = "/dev/spidev0.0";
  do {
    spi_path = pcVar8;
    iVar2 = __posix_getopt(argc,argv,"d:h");
    pcVar8 = _optarg;
  } while (iVar2 == 100);
  if (iVar2 == -1) {
    if (argc - _optind == 3) {
      uVar4 = strtol(argv[_optind],&tmp,0x10);
      if (*tmp == '\0') {
        lVar5 = (long)_optind;
        _optind = _optind + 1;
        uVar6 = strtol(argv[lVar5 + 1],&tmp,0);
        if (*tmp == '\0') {
          if ((uVar6 & 0xfffffff0) == 0) {
            lVar5 = (long)_optind;
            _optind = _optind + 1;
            pcVar8 = argv[lVar5 + 1];
            if (((*pcVar8 == 'o') && (pcVar8[1] == 'n')) && (pcVar8[2] == '\0')) {
              bVar1 = true;
            }
            else {
              iVar2 = strcmp(pcVar8,"off");
              if (iVar2 != 0) {
                pcVar8 = "Unknown direction argument\n";
                sStack_50 = 0x1b;
                goto LAB_001015b3;
              }
              bVar1 = false;
            }
            iVar2 = rf_open(&dev,spi_path);
            if (iVar2 == 0) {
              uVar3 = rf_config(&dev,433.92,0.0,1,26.666666666666668);
              if (uVar3 == 0) {
                local_34 = (uint8_t)(uVar4 >> 0x12);
                local_33 = (undefined1)(uVar4 >> 10);
                local_32 = (undefined1)(uVar4 >> 2);
                bVar7 = (char)uVar4 << 6;
                local_31 = bVar7 | 0x10;
                if (!bVar1) {
                  local_31 = bVar7;
                }
                local_31 = (byte)uVar6 | local_31;
                uVar3 = kaku_send(&dev,&local_34);
                rf_close(&dev);
                if (uVar3 == 0) {
                  return 0;
                }
                fprintf(_stderr,"ERROR: Failed sending command: %d\n",(ulong)uVar3);
              }
              else {
                fprintf(_stderr,"ERROR: Failed configuring module: %d\n",(ulong)uVar3);
                rf_close(&dev);
              }
            }
            goto LAB_00101513;
          }
          pcVar8 = "Unit number out of range(0-15)\n";
          sStack_50 = 0x1f;
        }
        else {
          pcVar8 = "Unparsable characters in unit argument\n";
          sStack_50 = 0x27;
        }
      }
      else {
        pcVar8 = "Unparsable characters in address argument\n";
        sStack_50 = 0x2a;
      }
LAB_001015b3:
      fwrite(pcVar8,sStack_50,1,_stderr);
      goto LAB_00101513;
    }
    fwrite("Incorrect amount of arguments\n",0x1e,1,_stderr);
  }
  else if (iVar2 == 0x68) {
    usage(*argv);
    exit(0);
  }
  usage(*argv);
LAB_00101513:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	int opt;
	const char *dev_path = DEFAULT_DEV_PATH;
	rf_dev_t dev;
	unsigned char kaku_data[4];
	enum { ButtonOn, ButtonOff } button;
	char *tmp;
	uint32_t addr;
	int unit;
	int ret;

	while ((opt = getopt(argc, argv, "d:h")) != -1) {
		switch (opt) {
		case 'd':
			dev_path = optarg;
			break;
		case 'h':
			usage(argv[0]);
			exit(EXIT_SUCCESS);
			break;
		default: /* '?' */
			usage(argv[0]);
			exit(EXIT_FAILURE);
		}
	}
	
	if (argc - optind != 3) {
		fprintf(stderr, "Incorrect amount of arguments\n");
		usage(argv[0]);
		exit(EXIT_FAILURE);
	}

	addr = strtol(argv[optind], &tmp, 16);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in address argument\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	unit = strtol(argv[optind], &tmp, 0);
	if (*tmp != '\0') {
		fprintf(stderr, "Unparsable characters in unit argument\n");
		exit(EXIT_FAILURE);
	}
	if (unit > 0xf || unit < 0) {
		fprintf(stderr, "Unit number out of range(0-15)\n");
		exit(EXIT_FAILURE);
	}
	optind++;

	if (strcmp(argv[optind], "on") == 0) {
		button = ButtonOn;
	} else if (strcmp(argv[optind], "off") == 0) {
		button = ButtonOff;
	} else {
		fprintf(stderr, "Unknown direction argument\n");
		exit(EXIT_FAILURE);
	}

	// Open SX1231
	if (rf_open(&dev, dev_path) != 0) {
		exit(EXIT_FAILURE);
	}

	ret = rf_config(&dev, 433.92, 0, SX1231_MODULATION_OOK, ENCODED_BITRATE);
	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed configuring module: %d\n", ret);
		rf_close(&dev);
		exit(EXIT_FAILURE);
	}

	// encode KAKU frame data
	kaku_data[0] = addr >> 18;
	kaku_data[1] = addr >> 10;
	kaku_data[2] = addr >> 2;
	kaku_data[3] = (addr << 6) & 0xc0;
	if (button == ButtonOn) {
		kaku_data[3] |= 0x10;
	} else {
		kaku_data[3] &= ~0x10;
	}
	kaku_data[3] = (kaku_data[3] & 0xF0) | (unit & 0x0F);

	// send frame
	ret = kaku_send(&dev, kaku_data);

	rf_close(&dev);

	if (ret != ERR_OK) {
		fprintf(stderr, "ERROR: Failed sending command: %d\n", ret);
		exit(EXIT_FAILURE);
	}

	return EXIT_SUCCESS;
}